

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

uint32 __thiscall
Js::TypedArrayBase::GetSourceLength
          (TypedArrayBase *this,RecyclableObject *arraySource,uint32 targetLength,uint32 offset)

{
  ScriptContext *scriptContext;
  uint32 uVar1;
  Var aValue;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  aValue = JavascriptOperators::OP_GetProperty(arraySource,0xd1,scriptContext);
  uVar1 = JavascriptConversion::ToUInt32(aValue,scriptContext);
  if ((!CARRY4(offset,uVar1)) && (offset + uVar1 <= targetLength)) {
    return uVar1;
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec24,(PCWSTR)0x0);
}

Assistant:

uint32 TypedArrayBase::GetSourceLength(RecyclableObject* arraySource, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetProperty(arraySource, PropertyIds::length, scriptContext), scriptContext);
        uint32 totalLength;
        if (UInt32Math::Add(offset, sourceLength, &totalLength) ||
            (totalLength > targetLength))
        {
            JavascriptError::ThrowRangeError(
                scriptContext, JSERR_InvalidTypedArrayLength);
        }
        return sourceLength;
    }